

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void trompeloeil::missed_value<trompeloeil::wildcard>(ostream *os,int i,wildcard *t)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefix;
  string local_38;
  
  param_name_prefix_abi_cxx11_(&local_38,(trompeloeil *)t,t);
  std::operator+(&prefix,&local_38,"_");
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<(os,"  param ");
  *(ulong *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (ulong)(i < 9) + 1;
  poVar1 = std::operator<<(poVar1,(string *)&prefix);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i + 1);
  std::operator<<(poVar1,"");
  std::operator<<(os," matching _");
  std::operator<<(os,'\n');
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void missed_value(
    std::ostream& os,
    int i,
    T const& t)
  {
    auto prefix = ::trompeloeil::param_name_prefix(&t) + "_";
    os << "  param " << std::setw((i < 9) ? 2 : 1) << prefix << i + 1
       << ::trompeloeil::param_compare_operator(&t);
    ::trompeloeil::print(os, t);
    os << '\n';
  }